

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.hpp
# Opt level: O2

void __thiscall
helics::TimeData::TimeData(TimeData *this,Time start,TimeState startState,uint8_t resLevel)

{
  (this->next).internalTimeCode = start.internalTimeCode;
  (this->Te).internalTimeCode = start.internalTimeCode;
  (this->minDe).internalTimeCode = start.internalTimeCode;
  (this->TeAlt).internalTimeCode = start.internalTimeCode;
  (this->lastGrant).internalTimeCode = 0;
  this->minFed = -2010000000;
  this->minFedActual = -2010000000;
  this->mTimeState = startState;
  this->hasData = false;
  this->interrupted = false;
  this->delayedTiming = false;
  this->timingVersion = -2;
  this->restrictionLevel = resLevel;
  this->timeoutCount = 0;
  this->sequenceCounter = 0;
  this->responseSequenceCounter = 0;
  this->grantedIteration = 0;
  return;
}

Assistant:

explicit TimeData(Time start,
                      TimeState startState = TimeState::initialized,
                      std::uint8_t resLevel = 0U):
        next{start}, Te{start}, minDe{start}, TeAlt{start}, mTimeState{startState},
        restrictionLevel{resLevel} {}